

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::load_srcfiles(CVmImageLoader *this,ulong siz)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong *remaining_size;
  unsigned_long uVar4;
  ulong *puVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  undefined8 in_RSI;
  char *in_RDI;
  ulong code_addr;
  ulong linenum;
  ulong skip_amt;
  ulong line_cnt;
  CVmSrcfEntry *entry;
  size_t len;
  int orig_index;
  long next_pos;
  long start_pos;
  size_t line_size;
  size_t entry_cnt;
  char buf [64];
  size_t i;
  ulong *in_stack_ffffffffffffff38;
  ulong *in_stack_ffffffffffffff40;
  CVmImageLoader *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  int orig_index_00;
  CVmSrcfEntry *in_stack_ffffffffffffff70;
  undefined1 local_58 [2];
  undefined1 auStack_56 [2];
  undefined1 auStack_54 [2];
  undefined1 auStack_52 [58];
  ulong local_18;
  
  if (G_srcf_table_X == (CVmSrcfTable *)0x0) {
    (**(code **)(**(long **)in_RDI + 0x48))(*(long **)in_RDI,in_RSI);
  }
  else {
    CVmSrcfTable::clear((CVmSrcfTable *)in_stack_ffffffffffffff50);
    read_data(in_stack_ffffffffffffff50,in_RDI,(size_t)in_stack_ffffffffffffff40,
              in_stack_ffffffffffffff38);
    iVar1 = ::osrp2(local_58);
    uVar2 = ::osrp2(auStack_56);
    for (local_18 = 0; orig_index_00 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
        local_18 < (ulong)(long)iVar1; local_18 = local_18 + 1) {
      remaining_size = (ulong *)(**(code **)(**(long **)in_RDI + 0x40))();
      read_data(in_stack_ffffffffffffff50,in_RDI,(size_t)in_stack_ffffffffffffff40,
                in_stack_ffffffffffffff38);
      ::osrp2(auStack_54);
      iVar3 = ::osrp2(auStack_52);
      uVar4 = ::osrp4(local_58);
      puVar5 = (ulong *)((long)remaining_size + (uVar4 & 0xffffffff));
      in_stack_ffffffffffffff70 =
           CVmSrcfTable::add_entry
                     ((CVmSrcfTable *)in_stack_ffffffffffffff70,orig_index_00,
                      in_stack_ffffffffffffff60);
      CVmSrcfEntry::get_name_buf(in_stack_ffffffffffffff70);
      read_data(in_stack_ffffffffffffff50,in_RDI,(size_t)remaining_size,in_stack_ffffffffffffff38);
      pcVar6 = CVmSrcfEntry::get_name_buf(in_stack_ffffffffffffff70);
      pcVar6[iVar3] = '\0';
      read_data(in_stack_ffffffffffffff50,in_RDI,(size_t)remaining_size,in_stack_ffffffffffffff38);
      uVar4 = ::osrp4(local_58);
      uVar7 = uVar4 & 0xffffffff;
      if ((uVar2 < 0x41) && (7 < uVar2)) {
        CVmSrcfEntry::alloc_line_records((CVmSrcfEntry *)in_stack_ffffffffffffff50,(ulong)in_RDI);
        for (; uVar7 != 0; uVar7 = uVar7 - 1) {
          read_data(in_stack_ffffffffffffff50,in_RDI,(size_t)remaining_size,
                    in_stack_ffffffffffffff38);
          ::osrp4(local_58);
          uVar4 = ::osrp4(auStack_54);
          in_stack_ffffffffffffff50 = (CVmImageLoader *)(uVar4 & 0xffffffff);
          CVmSrcfEntry::add_line_record
                    ((CVmSrcfEntry *)in_stack_ffffffffffffff50,(ulong)in_RDI,(ulong)remaining_size);
        }
      }
      in_stack_ffffffffffffff68 = 0;
      lVar8 = (**(code **)(**(long **)in_RDI + 0x40))();
      in_stack_ffffffffffffff60 = (long)puVar5 - lVar8;
      if (in_stack_ffffffffffffff60 != 0) {
        skip_data(in_stack_ffffffffffffff50,(size_t)in_RDI,remaining_size);
      }
      in_stack_ffffffffffffff38 = puVar5;
      in_stack_ffffffffffffff40 = remaining_size;
    }
  }
  return;
}

Assistant:

void CVmImageLoader::load_srcfiles(VMG_ ulong siz)
{
    size_t i;
    char buf[64];
    size_t entry_cnt;
    size_t line_size;

    /* 
     *   if there's no source file table, we're not in debug mode and hence
     *   have no use for this type of information, so skip the block 
     */
    if (G_srcf_table == 0)
    {
        /* skip the entire block in the file */
        fp_->skip_ahead(siz);

        /* we're done */
        return;
    }

    /* clear any existing information in the table */
    G_srcf_table->clear();

    /* read the number of entries in the table, and the line record size */
    read_data(buf, 4, &siz);
    entry_cnt = osrp2(buf);
    line_size = osrp2(buf + 2);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        long start_pos;
        long next_pos;
        int orig_index;
        size_t len;
        CVmSrcfEntry *entry;
        ulong line_cnt;
        ulong skip_amt;

        /* note the starting file location of this record */
        start_pos = fp_->get_seek();

        /* 
         *   read the size of this file record, the original index, and the
         *   length of the filename 
         */
        read_data(buf, 8, &siz);
        orig_index = osrp2(buf + 4);
        len = osrp2(buf + 6);

        /* 
         *   calculate the file location of the start of the next block by
         *   adding the starting position and size of this block 
         */
        next_pos = start_pos + t3rp4u(buf);

        /* allocate the entry */
        entry = G_srcf_table->add_entry(orig_index, len);

        /* read the data into this entry's buffer */
        read_data(entry->get_name_buf(), len, &siz);

        /* null-terminate the buffer */
        entry->get_name_buf()[len] = '\0';

        /* read the number of line records */
        read_data(buf, 4, &siz);
        line_cnt = t3rp4u(buf);

        /* 
         *   if the line records are too big for our buffer, or smaller than
         *   our required minimum size, don't bother reading them - we'll
         *   just skip them entirely 
         */
        if (line_size <= sizeof(buf) && line_size >= 8)
        {
            /* tell the source file table entry how many lines we have */
            entry->alloc_line_records(line_cnt);

            /* read the line records */
            for ( ; line_cnt != 0 ; --line_cnt)
            {
                ulong linenum;
                ulong code_addr;

                /* read the record */
                read_data(buf, line_size, &siz);

                /* get the source line number and byte code offset */
                linenum = t3rp4u(buf);
                code_addr = t3rp4u(buf + 4);

                /* add the line to the source file table entry */
                entry->add_line_record(linenum, code_addr);
            }
        }

        /* skip ahead to the start of the next record */
        skip_amt = next_pos - fp_->get_seek();
        if (skip_amt != 0)
            skip_data(skip_amt, &siz);
    }
}